

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  clock_t cVar1;
  clock_t cVar2;
  string predict_file;
  string answer_file;
  string test_file;
  string train_file;
  allocator local_c9;
  string local_c8;
  allocator local_a8 [32];
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  cVar1 = clock();
  std::__cxx11::string::string((string *)&local_28,"../data/train_data.txt",(allocator *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"../data/test_data2.txt",(allocator *)&local_c8);
  std::__cxx11::string::string((string *)&local_c8,"../data/result.txt",local_a8);
  std::__cxx11::string::string((string *)local_a8,"../data/answer.txt",&local_c9);
  Train(&local_28);
  Predict(&local_88,&local_c8);
  cVar2 = clock();
  printf(anon_var_dwarf_948f,(double)(cVar2 - cVar1) / 1000000.0);
  std::__cxx11::string::string((string *)&local_48,(string *)local_a8);
  std::__cxx11::string::string((string *)&local_68,(string *)&local_c8);
  Test(&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main (int argc, char *argv[]) {

#ifdef TEST
    clock_t start_time = clock() ;
#endif


#ifdef TEST // 线下测试用的数据路径
    string train_file = "../data/train_data.txt";
    string test_file = "../data/test_data2.txt";
    string predict_file = "../data/result.txt";
    string answer_file = "../data/answer.txt";
#else // 提交到线上，官方要求的数据路径
    string train_file = "/data/train_data.txt";
    string test_file = "/data/test_data.txt";
    string predict_file = "/projects/student/result.txt";
    string answer_file = "/projects/student/answer.txt";
#endif


    Train(train_file);

    Predict(test_file, predict_file);


#ifdef TEST
    clock_t end_time = clock();
    printf("总耗时（s）: %f \n", (double) (end_time - start_time) / CLOCKS_PER_SEC);
#endif

#ifdef TEST
    Test(answer_file, predict_file);
#endif
}